

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.cpp
# Opt level: O1

void __thiscall hash_table::resize(hash_table *this,size_t sizeMb)

{
  undefined8 *puVar1;
  ulong uVar2;
  hash_cluster *phVar3;
  size_t sVar4;
  hash_cluster *phVar5;
  ulong uVar6;
  size_t sVar7;
  
  this->sz_mb = sizeMb;
  sVar7 = (sizeMb & 0xfffffffffff) << 0xe;
  this->cluster_count = sVar7;
  sVar4 = pow2(sVar7);
  sVar7 = 0x400;
  if (0x400 < sVar4) {
    sVar7 = sVar4;
  }
  this->cluster_count = sVar7;
  phVar5 = (this->entries)._M_t.
           super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
           super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
           super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl;
  if (phVar5 != (hash_cluster *)0x0) {
    (this->entries)._M_t.super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>.
    _M_t.super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
    super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl = (hash_cluster *)0x0;
    operator_delete__(phVar5);
  }
  uVar2 = this->cluster_count;
  uVar6 = 0xffffffffffffffff;
  if (uVar2 < 0x400000000000000) {
    uVar6 = uVar2 << 6;
  }
  phVar5 = (hash_cluster *)operator_new__(uVar6);
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      puVar1 = (undefined8 *)((long)(phVar5->cluster_entries + 3) + uVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(phVar5->cluster_entries + 2) + uVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)(phVar5->cluster_entries + 1) + uVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&phVar5->cluster_entries[0].pkey + uVar6);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar6 = uVar6 + 0x40;
    } while (uVar2 << 6 != uVar6);
  }
  phVar3 = (this->entries)._M_t.
           super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
           super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
           super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl;
  (this->entries)._M_t.super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>.
  _M_t.super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
  super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl = phVar5;
  if (phVar3 != (hash_cluster *)0x0) {
    operator_delete__(phVar3);
  }
  memset((this->entries)._M_t.
         super___uniq_ptr_impl<hash_cluster,_std::default_delete<hash_cluster[]>_>._M_t.
         super__Tuple_impl<0UL,_hash_cluster_*,_std::default_delete<hash_cluster[]>_>.
         super__Head_base<0UL,_hash_cluster_*,_false>._M_head_impl,0,this->cluster_count << 6);
  return;
}

Assistant:

void hash_table::resize(size_t sizeMb) {
	sz_mb = sizeMb;
	cluster_count = 1024 * 1024 * sz_mb / sizeof(hash_cluster);
	cluster_count = pow2(cluster_count);
	if (cluster_count < 1024) 
		cluster_count = 1024;
	if (entries.get() != nullptr)
		entries.reset();

	entries = std::unique_ptr<hash_cluster[]>(new hash_cluster[cluster_count]());
	clear();
}